

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgrayraster.c
# Opt level: O1

int gray_raster_new(QT_FT_Raster *araster)

{
  int iVar1;
  QT_FT_Raster pTVar2;
  
  pTVar2 = (QT_FT_Raster)malloc(0x30);
  *araster = pTVar2;
  if (pTVar2 == (QT_FT_Raster)0x0) {
    *araster = (QT_FT_Raster)0x0;
    iVar1 = -4;
  }
  else {
    pTVar2->memory = (void *)0x0;
    pTVar2->worker = (PWorker)0x0;
    pTVar2->buffer_allocated_size = 0;
    *(undefined8 *)&pTVar2->band_size = 0;
    pTVar2->buffer = (void *)0x0;
    pTVar2->buffer_size = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
  gray_raster_new( QT_FT_Raster*  araster )
  {
    *araster = malloc(sizeof(TRaster));
    if (!*araster) {
        *araster = 0;
        return ErrRaster_Memory_Overflow;
    }
    QT_FT_MEM_ZERO(*araster, sizeof(TRaster));

    return 0;
  }